

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackScriptFunction.cpp
# Opt level: O2

uintptr_t Js::StackScriptFunction::BoxState::GetNativeScopeSlotsIndex(FunctionBody *functionBody)

{
  return (ulong)((functionBody->super_ParseableFunctionInfo).m_inParamCount == 0) |
         0xfffffffffffffffa;
}

Assistant:

uintptr_t StackScriptFunction::BoxState::GetNativeScopeSlotsIndex(FunctionBody * functionBody)
    {
#if _M_IX86 || _M_AMD64
        if (functionBody->GetInParamsCount() == 0)
        {
            return (uintptr_t)JavascriptFunctionArgIndex_StackScopeSlotsNoArg;
        }
        else
#endif
        {
            return (uintptr_t)JavascriptFunctionArgIndex_StackScopeSlots;
        }
    }